

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *vForAlls;
  int *piVar3;
  Vec_Int_t *vExists;
  char *pFileName;
  int iVar4;
  ulong uVar5;
  long lVar6;
  Vec_Int_t *p_00;
  
  __s = (void *)0x0;
  p = Mf_ManGenerateCnf(pGia,8,0,1,0);
  iVar1 = p->nVars;
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  if (iVar2 != 0) {
    __s = malloc((long)iVar2 << 2);
  }
  memset(__s,0,(long)iVar1 * 4);
  iVar2 = pGia->vCis->nSize;
  if (0 < (long)iVar2) {
    piVar3 = pGia->vCis->pArray;
    uVar5 = 0;
    do {
      iVar4 = piVar3[uVar5];
      if (((long)iVar4 < 0) || (pGia->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      if ((long)uVar5 < (long)nPars) {
        iVar4 = p->pVarNums[iVar4];
        if (((long)iVar4 < 0) || (iVar1 <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)((long)__s + (long)iVar4 * 4) = 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(long)iVar2);
  }
  vForAlls = (Vec_Int_t *)malloc(0x10);
  iVar4 = nPars;
  if (nPars - 1U < 0xf) {
    iVar4 = 0x10;
  }
  vForAlls->nSize = 0;
  vForAlls->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  vForAlls->pArray = piVar3;
  vExists = (Vec_Int_t *)malloc(0x10);
  iVar4 = iVar2 - nPars;
  if ((iVar2 - nPars) - 1U < 0xf) {
    iVar4 = 0x10;
  }
  vExists->nSize = 0;
  vExists->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  vExists->pArray = piVar3;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      p_00 = vExists;
      if (*(int *)((long)__s + lVar6 * 4) != 0) {
        p_00 = vForAlls;
      }
      Vec_IntPush(p_00,(int)lVar6);
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  pFileName = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName,0,vForAlls,vExists);
  Cnf_DataFree(p);
  if (vForAlls->pArray != (int *)0x0) {
    free(vForAlls->pArray);
  }
  free(vForAlls);
  if (vExists->pArray != (int *)0x0) {
    free(vExists->pArray);
  }
  free(vExists);
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( pGia, 8, 0, 1, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}